

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O0

void pnga_matmul(char *transa,char *transb,void *alpha,void *beta,Integer g_a,Integer ailo,
                Integer aihi,Integer ajlo,Integer ajhi,Integer g_b,Integer bilo,Integer bihi,
                Integer bjlo,Integer bjhi,Integer g_c,Integer cilo,Integer cihi,Integer cjlo,
                Integer cjhi)

{
  undefined1 auVar1 [16];
  int iVar2;
  Integer bjhi_00;
  Integer cjhi_00;
  Integer cjlo_00;
  logical aihi_00;
  logical lVar3;
  char *pcVar4;
  char *name;
  char *pcVar5;
  Integer cihi_00;
  DoubleComplex *a_00;
  double *in_RCX;
  char *in_RSI;
  char *in_RDI;
  Integer in_R8;
  void *in_R9;
  void *in_stack_00000008;
  char *in_stack_00000010;
  char *in_stack_00000018;
  Integer in_stack_00000020;
  void *in_stack_00000028;
  Integer *in_stack_00000030;
  Integer *in_stack_00000038;
  long in_stack_00000040;
  Integer in_stack_00000048;
  long in_stack_00000050;
  DoubleComplex *in_stack_00000058;
  long in_stack_00000060;
  long in_stack_00000068;
  Integer irreg;
  DoubleComplex *tmp;
  short nbuf;
  Integer factor;
  Integer elems;
  Integer chi [2];
  Integer clo [2];
  Integer numblocks;
  Integer c_grp;
  Integer b_grp;
  Integer a_grp;
  short use_armci_memory;
  short irregular;
  short use_NB_matmul;
  short need_scaling;
  int local_sync_end;
  int local_sync_begin;
  Integer hiC [2];
  Integer loC [2];
  Integer hiB [2];
  Integer loB [2];
  Integer hiA [2];
  Integer loA [2];
  Integer Jchunk;
  Integer Kchunk;
  Integer Ichunk;
  Integer k;
  Integer m;
  Integer n;
  Integer me;
  Integer rank;
  Integer ctype;
  Integer btype;
  Integer atype;
  Integer dims [2];
  Integer cdim2;
  Integer cdim1;
  Integer bdim2;
  Integer bdim1;
  Integer adim2;
  Integer adim1;
  DoubleComplex *c_ar [2];
  DoubleComplex *b_ar [2];
  DoubleComplex *a_ar [2];
  DoubleComplex *c;
  DoubleComplex *b;
  DoubleComplex *a;
  short in_stack_0001010c;
  short in_stack_0001010e;
  Integer in_stack_00010110;
  Integer in_stack_00010118;
  void *in_stack_00010120;
  void *in_stack_00010128;
  char *in_stack_00010130;
  char *in_stack_00010138;
  Integer in_stack_00010170;
  Integer in_stack_00010178;
  Integer in_stack_00010180;
  Integer in_stack_00010188;
  Integer in_stack_00010190;
  Integer in_stack_00010198;
  Integer in_stack_000101a0;
  Integer in_stack_000101a8;
  Integer in_stack_000101b0;
  Integer in_stack_000101b8;
  Integer in_stack_000101c0;
  Integer in_stack_000101c8;
  Integer in_stack_000101d0;
  Integer in_stack_000101d8;
  Integer in_stack_000101e0;
  Integer in_stack_000101e8;
  Integer in_stack_000101f0;
  DoubleComplex **in_stack_000101f8;
  DoubleComplex **in_stack_00010200;
  DoubleComplex **in_stack_00010208;
  char *in_stack_fffffffffffffba0;
  Integer in_stack_fffffffffffffba8;
  void *in_stack_fffffffffffffbb0;
  Integer Kchunk_00;
  Integer in_stack_fffffffffffffbb8;
  Integer Jchunk_00;
  Integer in_stack_fffffffffffffbc0;
  Integer Ichunk_00;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  Integer *in_stack_fffffffffffffc48;
  Integer *in_stack_fffffffffffffc50;
  Integer *in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  int iVar6;
  Integer in_stack_fffffffffffffc70;
  Integer in_stack_fffffffffffffc78;
  Integer in_stack_fffffffffffffc80;
  short in_stack_fffffffffffffc88;
  short in_stack_fffffffffffffc90;
  Integer in_stack_fffffffffffffc98;
  undefined8 in_stack_fffffffffffffd10;
  short need_scaling_00;
  Integer in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  Integer in_stack_fffffffffffffd38;
  char *in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd70;
  undefined4 uVar7;
  Integer in_stack_fffffffffffffd78;
  Integer in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  DoubleComplex *alpha_00;
  DoubleComplex *in_stack_fffffffffffffd98;
  DoubleComplex *in_stack_fffffffffffffda8;
  Integer *in_stack_fffffffffffffdb0;
  Integer *in_stack_fffffffffffffdb8;
  Integer g_c_00;
  Integer in_stack_fffffffffffffdc0;
  Integer cilo_00;
  Integer cihi_01;
  logical in_stack_fffffffffffffdd0;
  Integer ajlo_00;
  DoubleComplex *transa_00;
  DoubleComplex *pDVar8;
  undefined6 in_stack_fffffffffffffdf0;
  short sVar9;
  DoubleComplex *in_stack_fffffffffffffe00;
  DoubleComplex *c_00;
  Integer Ichunk_01;
  short sVar10;
  short sVar11;
  ushort uVar12;
  short sVar13;
  int iVar14;
  int iVar15;
  DoubleComplex **in_stack_fffffffffffffe58;
  DoubleComplex **in_stack_fffffffffffffe60;
  DoubleComplex **in_stack_fffffffffffffe68;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  Integer *in_stack_fffffffffffffea8;
  Integer *in_stack_fffffffffffffeb0;
  Integer in_stack_fffffffffffffeb8;
  Integer in_stack_fffffffffffffec0;
  long lVar16;
  long local_138;
  long local_130;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  DoubleComplex *local_88;
  
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffffd70 >> 0x20);
  need_scaling_00 = (short)((ulong)in_stack_fffffffffffffd10 >> 0x30);
  iVar6 = (int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  local_b0 = (char *)0x0;
  local_b8 = (char *)0x0;
  local_c0 = (char *)0x0;
  local_c8 = (char *)0x0;
  local_d0 = (char *)0x0;
  local_d8 = (char *)0x0;
  pnga_nodeid();
  memset(&stack0xfffffffffffffea8,0,0x10);
  memset(&local_168,0,0x10);
  memset(&local_178,0,0x10);
  memset(&local_188,0,0x10);
  memset(&stack0xfffffffffffffe68,0,0x10);
  memset(&stack0xfffffffffffffe58,0,0x10);
  sVar13 = 1;
  uVar12 = 1;
  sVar11 = 0;
  sVar10 = 0;
  bjhi_00 = pnga_get_pgroup(in_R8);
  cjhi_00 = pnga_get_pgroup(in_stack_00000020);
  cjlo_00 = pnga_get_pgroup(in_stack_00000048);
  iVar14 = _ga_sync_end;
  iVar15 = _ga_sync_begin;
  CYCLIC_DISTR_OPT_FLAG = 0;
  CONTIG_CHUNKS_OPT_FLAG = 1;
  DIRECT_ACCESS_OPT_FLAG = 1;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar15 != 0) {
    pnga_pgroup_sync((Integer)in_stack_fffffffffffffba0);
  }
  if ((bjhi_00 != cjhi_00) || (bjhi_00 != cjlo_00)) {
    pnga_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  }
  aihi_00 = pnga_is_mirrored(in_R8);
  lVar3 = pnga_is_mirrored(in_stack_00000020);
  if (aihi_00 == lVar3) {
    in_stack_fffffffffffffdd0 = pnga_is_mirrored(in_R8);
    lVar3 = pnga_is_mirrored(in_stack_00000048);
    if (in_stack_fffffffffffffdd0 == lVar3) goto LAB_001eabe5;
  }
  pnga_nnodes();
  pnga_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
LAB_001eabe5:
  pnga_inquire(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
               (Integer *)in_stack_fffffffffffffda8);
  if (local_108 < 3) {
    if (local_108 == 2) {
      local_b0 = local_e8;
      local_b8 = local_e0;
    }
    else if (local_108 == 1) {
      if ((long)in_stack_00000008 - (long)in_R9 < 1) {
        local_b0 = (char *)0x1;
        local_b8 = local_e8;
      }
      else {
        local_b0 = local_e8;
        local_b8 = (char *)0x1;
      }
    }
    else {
      pnga_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    }
  }
  else {
    pnga_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  }
  pnga_inquire(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
               (Integer *)in_stack_fffffffffffffda8);
  if (local_108 < 3) {
    if (local_108 == 2) {
      local_c0 = local_e8;
      local_c8 = local_e0;
    }
    else if (local_108 == 1) {
      if ((long)in_stack_00000030 - (long)in_stack_00000028 < 1) {
        local_c0 = (char *)0x1;
        local_c8 = local_e8;
      }
      else {
        local_c0 = local_e8;
        local_c8 = (char *)0x1;
      }
    }
    else {
      pnga_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    }
  }
  else {
    pnga_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  }
  pnga_inquire(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
               (Integer *)in_stack_fffffffffffffda8);
  if (local_108 < 3) {
    if (local_108 == 2) {
      local_d0 = local_e8;
      local_d8 = local_e0;
    }
    else if (local_108 == 1) {
      if ((long)in_stack_00000058 - in_stack_00000050 < 1) {
        local_d0 = (char *)0x1;
        local_d8 = local_e8;
      }
      else {
        local_d0 = local_e8;
        local_d8 = (char *)0x1;
      }
    }
    else {
      pnga_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    }
  }
  else {
    pnga_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  }
  if ((local_f0 != local_f8) || (local_f0 != local_100)) {
    pnga_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  }
  if ((((local_f0 != 0x3ef) && (local_f0 != 0x3ec)) && (local_f0 != 0x3eb)) && (local_f0 != 0x3ee))
  {
    pnga_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  }
  if ((*in_RDI == 'n') || (*in_RDI == 'N')) {
    if ((((long)in_R9 < 1) ||
        (((long)local_b0 < (long)in_stack_00000008 || ((long)in_stack_00000010 < 1)))) ||
       ((long)local_b8 < (long)in_stack_00000018)) {
      pnga_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    }
  }
  else if (((((long)in_R9 < 1) || ((long)local_b8 < (long)in_stack_00000008)) ||
           ((long)in_stack_00000010 < 1)) || ((long)local_b0 < (long)in_stack_00000018)) {
    pnga_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  }
  if ((*in_RSI == 'n') || (*in_RSI == 'N')) {
    if ((((long)in_stack_00000028 < 1) ||
        (((long)local_c0 < (long)in_stack_00000030 || ((long)in_stack_00000038 < 1)))) ||
       ((long)local_c8 < in_stack_00000040)) {
      pnga_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    }
  }
  else if (((((long)in_stack_00000028 < 1) || ((long)local_c8 < (long)in_stack_00000030)) ||
           ((long)in_stack_00000038 < 1)) || ((long)local_c0 < in_stack_00000040)) {
    pnga_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  }
  if (((in_stack_00000050 < 1) || ((long)local_d0 < (long)in_stack_00000058)) ||
     ((in_stack_00000060 < 1 || ((long)local_d8 < in_stack_00000068)))) {
    pnga_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  }
  pcVar4 = (char *)((long)in_stack_00000008 + (1 - (long)in_R9));
  name = (char *)((in_stack_00000040 - (long)in_stack_00000038) + 1);
  pcVar5 = in_stack_00000018 + (1 - (long)in_stack_00000010);
  if ((char *)((long)in_stack_00000058 + (1 - in_stack_00000050)) != pcVar4) {
    pnga_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  }
  if ((char *)((in_stack_00000068 - in_stack_00000060) + 1) != name) {
    pnga_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  }
  if ((char *)((long)in_stack_00000030 + (1 - (long)in_stack_00000028)) != pcVar5) {
    pnga_error(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  }
  if (((GA[in_stack_00000048 + 1000].irreg == 1) || (GA[in_stack_00000020 + 1000].irreg == 1)) ||
     ((GA[in_R8 + 1000].irreg == 1 || (_gai_matmul_patch_flag == 1)))) {
    sVar11 = 1;
  }
  pnga_inquire(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
               (Integer *)in_stack_fffffffffffffda8);
  if ((local_e8 != pcVar4) || (local_e0 != name)) {
    sVar11 = 1;
  }
  if (sVar11 == 0) {
    iVar2 = GA_Cluster_nnodes();
    if (iVar2 < 2) {
      CONTIG_CHUNKS_OPT_FLAG = 0;
      DIRECT_ACCESS_OPT_FLAG = 0;
    }
    uVar12 = (ushort)(iVar2 >= 2);
  }
  cihi_00 = pnga_total_blocks(in_stack_00000048);
  if (cihi_00 < 0) {
    pnga_distribution(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                      in_stack_fffffffffffffea8);
    pnga_distribution(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                      in_stack_fffffffffffffea8);
    pnga_distribution(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                      in_stack_fffffffffffffea8);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = ga_types[local_f0 + -1000].size;
    a_00 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10)) / auVar1,0);
    sVar9 = 1;
    transa_00 = (DoubleComplex *)0x0;
    if ((local_168 - (long)in_stack_fffffffffffffea8) + 1 <
        (long)in_stack_fffffffffffffe58 + (1 - (long)in_stack_fffffffffffffe68)) {
      local_168 = local_168 - (long)in_stack_fffffffffffffea8;
    }
    else {
      local_168 = (long)in_stack_fffffffffffffe58 - (long)in_stack_fffffffffffffe68;
    }
    cihi_01 = local_168 + 1;
    if ((local_180 - local_170) + 1 < (long)in_stack_fffffffffffffe60 + (1 - local_190)) {
      local_180 = local_180 - local_170;
    }
    else {
      local_180 = (long)in_stack_fffffffffffffe60 - local_190;
    }
    cilo_00 = local_180 + 1;
    if ((local_188 - local_178) + 1 < (local_160 - (long)in_stack_fffffffffffffeb0) + 1) {
      local_160 = local_188 - local_178;
    }
    else {
      local_160 = local_160 - (long)in_stack_fffffffffffffeb0;
    }
    g_c_00 = local_160 + 1;
    local_130 = cihi_01;
    if (cihi_01 < 1) {
      local_130 = 1;
    }
    lVar16 = cilo_00;
    if (cilo_00 < 1) {
      lVar16 = 1;
    }
    local_138 = g_c_00;
    if (g_c_00 < 1) {
      local_138 = 1;
    }
    ajlo_00 = 0;
    if ((((3 < local_130 / local_138) || (3 < local_138 / local_130)) || (3 < lVar16 / local_138))
       || (3 < local_138 / lVar16)) {
      ajlo_00 = 1;
    }
    Ichunk_00 = bjhi_00;
    pnga_type_f2c(0x3f2);
    pnga_pgroup_gop(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                    in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    if (ajlo_00 == 1) {
      sVar11 = 1;
    }
    if (uVar12 != 0) {
      sVar9 = 2;
    }
    if ((sVar11 == 0) &&
       (transa_00 = gai_get_armci_memory
                              (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                               (Integer)in_stack_fffffffffffffbb0,
                               (short)((ulong)in_stack_fffffffffffffba8 >> 0x30),
                               (Integer)in_stack_fffffffffffffba0), local_88 = transa_00,
       transa_00 != (DoubleComplex *)0x0)) {
      sVar10 = 1;
    }
    Kchunk_00 = CONCAT44((int)((ulong)in_stack_fffffffffffffbb0 >> 0x20),(int)sVar9);
    Jchunk_00 = CONCAT44((int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),(int)sVar10);
    Ichunk_01 = Ichunk_00;
    gai_get_chunk_size(iVar6,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                       in_stack_fffffffffffffc48,
                       (Integer *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                       CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                       in_stack_fffffffffffffc70,in_stack_fffffffffffffc78,in_stack_fffffffffffffc80
                       ,in_stack_fffffffffffffc88,in_stack_fffffffffffffc90,
                       in_stack_fffffffffffffc98);
    iVar6 = (int)((ulong)pcVar5 >> 0x20);
    if ((transa_00 == (DoubleComplex *)0x0) &&
       (transa_00 = gai_get_armci_memory
                              (Ichunk_00,Jchunk_00,Kchunk_00,(short)((ulong)pcVar5 >> 0x30),
                               (Integer)name), local_88 = transa_00,
       transa_00 != (DoubleComplex *)0x0)) {
      sVar10 = 1;
    }
    if (transa_00 == (DoubleComplex *)0x0) {
      transa_00 = (DoubleComplex *)pnga_malloc(Kchunk_00,iVar6,name);
      local_88 = transa_00;
    }
    if (uVar12 != 0) {
      transa_00 = local_88 + (local_130 * local_138) / (long)a_00 + 1;
      in_stack_fffffffffffffda8 = local_88;
    }
    pDVar8 = transa_00 + (local_130 * local_138) / (long)a_00 + 1;
    alpha_00 = pDVar8;
    if (uVar12 != 0) {
      alpha_00 = pDVar8 + (local_138 * lVar16) / (long)a_00 + 1;
      in_stack_fffffffffffffd98 = pDVar8;
    }
    if (local_f0 == 0x3ef) {
      if (((*in_RCX == 0.0) && (!NAN(*in_RCX))) && ((in_RCX[1] == 0.0 && (!NAN(in_RCX[1]))))) {
        sVar13 = 0;
      }
    }
    else if (local_f0 == 0x3ee) {
      if ((((*(float *)in_RCX == 0.0) && (!NAN(*(float *)in_RCX))) &&
          (*(float *)((long)in_RCX + 4) == 0.0)) && (!NAN(*(float *)((long)in_RCX + 4)))) {
        sVar13 = 0;
      }
    }
    else if (local_f0 == 0x3ec) {
      if ((*in_RCX == 0.0) && (!NAN(*in_RCX))) {
        sVar13 = 0;
      }
    }
    else if ((*(float *)in_RCX == 0.0) && (!NAN(*(float *)in_RCX))) {
      sVar13 = 0;
    }
    pDVar8 = alpha_00;
    c_00 = in_stack_00000058;
    lVar16 = in_stack_00000050;
    if (sVar13 != 0) {
      pnga_scale_patch(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
    }
    if (uVar12 == 0) {
      gai_matmul_shmem(in_stack_00000018,in_stack_00000010,in_stack_00000008,in_R9,
                       CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                       in_stack_fffffffffffffd18,in_stack_00000048,in_stack_00000050,
                       (Integer)in_stack_00000058,CONCAT44((int)sVar13,in_stack_fffffffffffffd88),
                       (Integer)alpha_00,(Integer)in_stack_fffffffffffffd98,(Integer)transa_00,
                       (Integer)in_stack_fffffffffffffda8,bjhi_00,g_c_00,cilo_00,cihi_01,
                       in_stack_fffffffffffffdd0,aihi_00,ajlo_00,(Integer)pDVar8,
                       CONCAT26(sVar9,in_stack_fffffffffffffdf0),a_00,in_stack_fffffffffffffe00,c_00
                       ,need_scaling_00);
    }
    else if (sVar11 == 0) {
      gai_matmul_regular(in_stack_00010138,in_stack_00010130,in_stack_00010128,in_stack_00010120,
                         in_stack_00010118,in_stack_00010110,in_stack_00010170,in_stack_00010178,
                         in_stack_00010180,in_stack_00010188,in_stack_00010190,in_stack_00010198,
                         in_stack_000101a0,in_stack_000101a8,in_stack_000101b0,in_stack_000101b8,
                         in_stack_000101c0,in_stack_000101c8,in_stack_000101d0,in_stack_000101d8,
                         in_stack_000101e0,in_stack_000101e8,in_stack_000101f0,in_stack_000101f8,
                         in_stack_00010200,in_stack_00010208,in_stack_0001010e,in_stack_0001010c);
    }
    else {
      gai_matmul_irreg((char *)transa_00,(char *)in_stack_fffffffffffffd98,alpha_00,
                       (void *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                       in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffdd0
                       ,aihi_00,ajlo_00,(Integer)pDVar8,CONCAT26(sVar9,in_stack_fffffffffffffdf0),
                       (Integer)a_00,(Integer)in_stack_fffffffffffffe00,(Integer)c_00,
                       in_stack_00000068,lVar16,in_stack_00000060,cihi_00,cjlo_00,cjhi_00,Ichunk_01,
                       CONCAT26(sVar13,CONCAT24(uVar12,CONCAT22(sVar11,sVar10))),
                       CONCAT44(iVar15,iVar14),in_stack_fffffffffffffe58,in_stack_fffffffffffffe60,
                       in_stack_fffffffffffffe68,(short)((uint)uVar7 >> 0x10),(short)uVar7);
    }
    if (sVar10 == 1) {
      ARMCI_Free_local((void *)0x1ec320);
    }
    else {
      pnga_free((void *)0x1ec32f);
    }
    if (iVar14 != 0) {
      pnga_pgroup_sync((Integer)in_stack_00000008);
    }
  }
  else {
    pnga_matmul_basic((char *)rank,(char *)me,(void *)n,(void *)m,k,(Integer *)Ichunk,
                      (Integer *)cdim2,cdim1,(Integer *)bdim2,(Integer *)bdim1,adim2,
                      (Integer *)adim1,(Integer *)c_ar[0]);
  }
  return;
}

Assistant:

void pnga_matmul(transa, transb, alpha, beta,
	       g_a, ailo, aihi, ajlo, ajhi,
	       g_b, bilo, bihi, bjlo, bjhi,
	       g_c, cilo, cihi, cjlo, cjhi)
     
     Integer g_a, ailo, aihi, ajlo, ajhi;    /* patch of g_a */
     Integer g_b, bilo, bihi, bjlo, bjhi;    /* patch of g_b */
     Integer g_c, cilo, cihi, cjlo, cjhi;    /* patch of g_c */
     void    *alpha, *beta;
     char    *transa, *transb;
{
    DoubleComplex *a=NULL, *b, *c, *a_ar[2], *b_ar[2], *c_ar[2];
    Integer adim1=0, adim2=0, bdim1=0, bdim2=0, cdim1=0, cdim2=0, dims[2];
    Integer atype, btype, ctype, rank, me= pnga_nodeid();
    Integer n, m, k, Ichunk, Kchunk, Jchunk;
    Integer loA[2]={0,0}, hiA[2]={0,0};
    Integer loB[2]={0,0}, hiB[2]={0,0};
    Integer loC[2]={0,0}, hiC[2]={0,0};
    int local_sync_begin,local_sync_end;
    short int need_scaling=SET,use_NB_matmul=SET;
    short int irregular=UNSET, use_armci_memory=UNSET;
    Integer a_grp=pnga_get_pgroup(g_a), b_grp=pnga_get_pgroup(g_b);
    Integer c_grp=pnga_get_pgroup(g_c);
    Integer numblocks;
    Integer clo[2], chi[2];

    /* OPTIMIZATIONS FLAGS. To unset an optimization, replace SET by UNSET) */
    CYCLIC_DISTR_OPT_FLAG  = UNSET;
    CONTIG_CHUNKS_OPT_FLAG = SET;
    DIRECT_ACCESS_OPT_FLAG = SET;

    local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if(local_sync_begin)pnga_pgroup_sync(a_grp);


    if (a_grp != b_grp || a_grp != c_grp)
       pnga_error("Arrays must be defined on same group",0L);
# if 0 /* disabled. should not fail if there are non-overlapping patches*/
    /* check if C is different from A and B */
    if (g_c == g_a || g_c == g_b)
       pnga_error("Global Array C should be different from A and B", 0);
#endif
    
    /**************************************************
     * Do All Sanity Checks 
     **************************************************/

    /* Check to make sure all global arrays are of the same type */
    if (!(pnga_is_mirrored(g_a) == pnga_is_mirrored(g_b) &&
	  pnga_is_mirrored(g_a) == pnga_is_mirrored(g_c))) {
       pnga_error("Processors do not match for all arrays",pnga_nnodes());
    }

    /* check if ranks are O.K. */
    pnga_inquire(g_a, &atype, &rank, dims); 
    VECTORCHECK(rank, dims, adim1, adim2, ailo, aihi, ajlo, ajhi);
    pnga_inquire(g_b, &btype, &rank, dims); 
    VECTORCHECK(rank, dims, bdim1, bdim2, bilo, bihi, bjlo, bjhi);
    pnga_inquire(g_c, &ctype, &rank, dims); 
    VECTORCHECK(rank, dims, cdim1, cdim2, cilo, cihi, cjlo, cjhi);

    /* check for data-types mismatch */
    if(atype != btype || atype != ctype ) pnga_error(" types mismatch ", 0L);
    if(atype != C_DCPL && atype != C_DBL && atype != C_FLOAT && atype!=C_SCPL)
       pnga_error(" type error",atype);
   
    /* check if patch indices and dims match */
    if (*transa == 'n' || *transa == 'N'){
       if (ailo <= 0 || aihi > adim1 || ajlo <= 0 || ajhi > adim2)
	  pnga_error("  g_a indices out of range ", g_a);
    }else
       if (ailo <= 0 || aihi > adim2 || ajlo <= 0 || ajhi > adim1)
	  pnga_error("  g_a indices out of range ", g_a);
   
    if (*transb == 'n' || *transb == 'N'){
       if (bilo <= 0 || bihi > bdim1 || bjlo <= 0 || bjhi > bdim2)
	  pnga_error("  g_b indices out of range ", g_b);
    }else
       if (bilo <= 0 || bihi > bdim2 || bjlo <= 0 || bjhi > bdim1)
	  pnga_error("  g_b indices out of range ", g_b);
   
    if (cilo <= 0 || cihi > cdim1 || cjlo <= 0 || cjhi > cdim2)
       pnga_error("  g_c indices out of range ", g_c);

    /* verify if patch dimensions are consistent */
    m = aihi - ailo +1;
    n = bjhi - bjlo +1;
    k = ajhi - ajlo +1;
    if( (cihi - cilo +1) != m) pnga_error(" a & c dims error",m);
    if( (cjhi - cjlo +1) != n) pnga_error(" b & c dims error",n);
    if( (bihi - bilo +1) != k) pnga_error(" a & b dims error",k);

#if DEBUG_
    if(me==0) check_result(0, transa, transb, alpha, beta, atype,
			   g_a, ailo, aihi, ajlo, ajhi,
			   g_b, bilo, bihi, bjlo, bjhi,
			   g_c, cilo, cihi, cjlo, cjhi);
    pnga_sync();
#endif

    /* switch to various matmul algorithms here. more to come */
    if( GA[GA_OFFSET + g_c].irreg == 1 ||
	GA[GA_OFFSET + g_b].irreg == 1 ||
	GA[GA_OFFSET + g_a].irreg == 1 ||
	_gai_matmul_patch_flag == SET) irregular = SET;

    /* even ga_dgemm is called, m,n & k might not match GA dimensions */
    pnga_inquire(g_c, &ctype, &rank, dims);
    if(dims[0] != m || dims[1] != n) irregular = SET; /* C matrix dims */

    if(!irregular) {
       if((adim1=GA_Cluster_nnodes()) > 1) use_NB_matmul = SET;
       else {
	  use_NB_matmul = UNSET;
	  CONTIG_CHUNKS_OPT_FLAG = UNSET;
	  DIRECT_ACCESS_OPT_FLAG = UNSET;
       }
    }

    /* if block cyclic, then use regular algorithm. This is turned on for now
     * to test block cyclic */ 
    numblocks = pnga_total_blocks(g_c);
    if(numblocks>=0) {
#if 0
       irregular     = UNSET;
       use_NB_matmul = SET; 
#else
       loA[0] = ailo;
       loA[1] = ajlo;
       hiA[0] = aihi;
       hiA[1] = ajhi;
       loB[0] = bilo;
       loB[1] = bjlo;
       hiB[0] = bihi;
       hiB[1] = bjhi;
       loC[0] = cilo;
       loC[1] = cjlo;
       hiC[0] = cihi;
       hiC[1] = cjhi;
       pnga_matmul_basic(transa, transb, alpha, beta, g_a, loA, hiA,
         g_b, loB, hiB, g_c, loC, hiC);
       return;
#endif
    }
    
    /****************************************************************
     * Get the memory (i.e.static or dynamic) for temporary buffers 
     ****************************************************************/

    /* to skip accumulate and exploit data locality:
       get chunks according to "C" matrix distribution*/
    pnga_distribution(g_a, me, loA, hiA);
    pnga_distribution(g_b, me, loB, hiB);
    pnga_distribution(g_c, me, loC, hiC);

       {
	  Integer elems, factor=sizeof(DoubleComplex)/GAsizeofM(atype);
	  short int nbuf=1;
	  DoubleComplex *tmp = NULL;

	  Ichunk = GA_MIN( (hiC[0]-loC[0]+1), (hiA[0]-loA[0]+1) );
	  Jchunk = GA_MIN( (hiC[1]-loC[1]+1), (hiB[1]-loB[1]+1) );
	  Kchunk = GA_MIN( (hiA[1]-loA[1]+1), (hiB[0]-loB[0]+1) );

#if KCHUNK_OPTIMIZATION /*works great for m=1000,n=1000,k=4000 kinda cases*/
	  pnga_distribution(g_a, me, loC, hiC);
	  Kchunk = hiC[1]-loC[1]+1;
	  pnga_distribution(g_b, me, loC, hiC);
	  Kchunk = GA_MIN(Kchunk, (hiC[0]-loC[0]+1));
#endif

	  /* Just to avoid divide by zero error */
          if(Ichunk<=0) Ichunk = 1;
          if(Jchunk<=0) Jchunk = 1;
          if(Kchunk<=0) Kchunk = 1;

	  {
	     Integer irreg=0;
	     if(Ichunk/Kchunk > GA_ASPECT_RATIO || Kchunk/Ichunk > GA_ASPECT_RATIO || 
		Jchunk/Kchunk > GA_ASPECT_RATIO || Kchunk/Jchunk > GA_ASPECT_RATIO) {
                irreg = SET;
             }
	     pnga_pgroup_gop(a_grp, pnga_type_f2c(MT_F_INT), &irreg, (Integer)1, "max");   
	     if(irreg==SET) irregular = SET;
	  }
	  
	  /* If non-blocking, we need 2 temporary buffers for A and B matrix */
	  if(use_NB_matmul) nbuf = 2; 
	  
	  if(!irregular) {
	     tmp = a_ar[0] =a=gai_get_armci_memory(Ichunk,Jchunk,Kchunk,
						   nbuf, atype);
	     if(tmp != NULL) use_armci_memory = SET;
	  }
	  
	  /* get ChunkSize (i.e.BlockSize), that fits in temporary buffer */
	  gai_get_chunk_size(irregular, &Ichunk, &Jchunk, &Kchunk, &elems, 
			     atype, m, n, k, nbuf, use_armci_memory, a_grp);
	  
	  if(tmp == NULL) { /* try once again from armci for new chunk sizes */
	     tmp = a_ar[0] =a=gai_get_armci_memory(Ichunk,Jchunk,Kchunk,
						   nbuf, atype);
	     if(tmp != NULL) use_armci_memory = SET;
	  }

	  if(tmp == NULL) { /*if armci malloc fails again, then get from MA */
	     tmp = a_ar[0] = a =(DoubleComplex*) pnga_malloc(elems,atype,
                                                      "GA mulmat bufs");
	  }

	  if(use_NB_matmul) tmp = a_ar[1] = a_ar[0] + (Ichunk*Kchunk)/factor+1;
	  
	  tmp = b_ar[0] = b = tmp + (Ichunk*Kchunk)/factor + 1;
	  if(use_NB_matmul) tmp = b_ar[1] = b_ar[0] + (Kchunk*Jchunk)/factor+1;
	  
	  c_ar[0] = c = tmp + (Kchunk*Jchunk)/factor + 1;
       }
       
       /** check if there is a need for scaling the data. 
	   Note: if beta=0, then need_scaling=0  */
       if(atype==C_DCPL){
	  if((((DoubleComplex*)beta)->real == 0) && 
	     (((DoubleComplex*)beta)->imag ==0)) need_scaling =0;} 
       else if(atype==C_SCPL){
	  if((((SingleComplex*)beta)->real == 0) && 
	     (((SingleComplex*)beta)->imag ==0)) need_scaling =0;} 
       else if(atype==C_DBL){
	  if(*(DoublePrecision *)beta == 0) need_scaling =0;}
       else if( *(float*)beta ==0) need_scaling =0;

       clo[0] = cilo; clo[1] = cjlo;
       chi[0] = cihi; chi[1] = cjhi;
       if(need_scaling) pnga_scale_patch(g_c, clo, chi, beta);

       /********************************************************************
	* Parallel Matrix Multiplication Starts Here.
	* 3 Steps:
	*    1. Get a chunk of A and B matrix, and store it in local buffer.
	*    2. Do sequential dgemm.
	*    3. Put/accumulate the result into C matrix.
	*********************************************************************/

       /* if only one node, then enable the optimized shmem code */
       if(use_NB_matmul==UNSET) { 
	  gai_matmul_shmem(transa, transb, alpha, beta, atype,
			   g_a, ailo, aihi, ajlo, ajhi,
			   g_b, bilo, bihi, bjlo, bjhi,
			   g_c, cilo, cihi, cjlo, cjhi,
			   Ichunk, Kchunk, Jchunk, a,b,c, need_scaling);
       }
       else {
	  if(irregular)
	     gai_matmul_irreg(transa, transb, alpha, beta, atype,
			      g_a, ailo, aihi, ajlo, ajhi,
			      g_b, bilo, bihi, bjlo, bjhi,
			      g_c, cilo, cihi, cjlo, cjhi,
			      Ichunk, Kchunk, Jchunk, a_ar, b_ar, c_ar,
			      need_scaling, irregular);
	  else {
	     gai_matmul_regular(transa, transb, alpha, beta, atype,
				g_a, ailo, aihi, ajlo, ajhi,
				g_b, bilo, bihi, bjlo, bjhi,
				g_c, cilo, cihi, cjlo, cjhi,
				Ichunk, Kchunk, Jchunk, a_ar, b_ar, c_ar, 
				need_scaling, irregular);
     }
       }
	     
       a = a_ar[0];
       if(use_armci_memory == SET) ARMCI_Free_local(a);
       else {
         pnga_free(a);
       }
       
#if DEBUG_
       Integer grp_me;
       grp_me = pnga_pgroup_nodeid(a_grp);
       pnga_pgroup_sync(a_grp);
       if(me==0) check_result(1, transa, transb, alpha, beta, atype,
			      g_a, ailo, aihi, ajlo, ajhi,
			      g_b, bilo, bihi, bjlo, bjhi,
			      g_c, cilo, cihi, cjlo, cjhi);
       pnga_pgroup_sync(a_grp);
#endif
       
       if(local_sync_end)pnga_pgroup_sync(a_grp);
}